

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O2

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  int i_2;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  void *pvVar22;
  float *pfVar23;
  ulong uVar24;
  int i_1;
  long lVar25;
  int iVar26;
  int iVar27;
  int kj;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  float fVar33;
  void *local_128;
  void *local_120;
  void *local_118;
  allocator_type local_e1;
  void *local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  ulong local_c0;
  long local_b8;
  void *local_b0;
  Mat local_a8;
  long local_60;
  long local_58;
  void *local_50;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  iVar17 = bottom_blob->w;
  iVar18 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  uVar19 = (ulong)uVar3;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_a8.cstep = 0;
      local_a8.data = (void *)0x0;
      local_a8.refcount._0_4_ = 0;
      local_a8.refcount._4_4_ = 0;
      local_a8.elemsize._0_4_ = 0;
      local_a8.elemsize._4_4_ = 0;
      local_a8.elempack = 0;
      local_a8.allocator = (Allocator *)0x0;
      local_a8.dims = 0;
      local_a8.w = 0;
      local_a8.h = 0;
      local_a8.d = 0;
      local_a8.c = 0;
      make_padding(this,bottom_blob,&local_a8,opt);
      iVar4 = local_a8.h;
      iVar18 = local_a8.w;
      iVar17 = -100;
      if ((local_a8.data != (void *)0x0) && ((long)local_a8.c * local_a8.cstep != 0)) {
        iVar20 = (local_a8.w - this->kernel_w) / this->stride_w;
        iVar26 = (local_a8.h - this->kernel_h) / this->stride_h;
        iVar10 = iVar20 + 1;
        Mat::create(top_blob,iVar10,iVar26 + 1,uVar3,sVar5,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar15 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,uVar15,&local_e1);
          iVar17 = this->kernel_w;
          iVar12 = iVar18 - iVar17;
          lVar16 = 0;
          iVar11 = 0;
          for (iVar13 = 0; iVar13 < this->kernel_h; iVar13 = iVar13 + 1) {
            for (lVar30 = 0; iVar27 = (int)lVar30, iVar27 < iVar17; lVar30 = lVar30 + 1) {
              _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[(int)lVar16 + lVar30] = iVar11 + iVar27;
              iVar17 = this->kernel_w;
            }
            iVar11 = iVar11 + iVar12 + iVar27;
            lVar16 = (int)lVar16 + lVar30;
          }
          iVar17 = (int)uVar15;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar17 = 0;
              iVar12 = 0;
              if (this->pad_mode == 0) {
                iVar17 = (bottom_blob->w - local_a8.w) + this->pad_left + this->pad_right;
                iVar12 = (bottom_blob->h - local_a8.h) + this->pad_top + this->pad_bottom;
              }
              local_b0 = local_a8.data;
              local_50 = top_blob->data;
              local_58 = top_blob->cstep * top_blob->elemsize;
              iVar17 = iVar17 + iVar18;
              local_b8 = (long)iVar10;
              if ((int)uVar3 < 1) {
                uVar19 = 0;
              }
              local_60 = local_a8.cstep *
                         CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              lVar16 = (long)local_a8.w *
                       CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize);
              local_d8 = (void *)CONCAT44(local_d8._4_4_,iVar17);
              local_e0 = (void *)CONCAT44(local_e0._4_4_,iVar12 + iVar4);
              uVar15 = 0;
              while (uVar21 = uVar15, uVar21 != uVar19) {
                local_120 = (void *)(local_58 * uVar21 + (long)local_50);
                local_c8 = (long)this->stride_h;
                local_d0 = lVar16 * local_c8;
                local_118 = local_b0;
                for (lVar30 = 0; lVar30 <= iVar26; lVar30 = lVar30 + 1) {
                  iVar18 = this->stride_w;
                  uVar3 = this->kernel_h;
                  if (this->kernel_h < 1) {
                    uVar3 = 0;
                  }
                  lVar32 = 0;
                  pvVar31 = local_118;
                  for (lVar25 = 0; lVar25 <= iVar20; lVar25 = lVar25 + 1) {
                    uVar24 = 0;
                    uVar15 = (ulong)(uint)this->kernel_w;
                    if (this->kernel_w < 1) {
                      uVar15 = uVar24;
                    }
                    fVar33 = 0.0;
                    iVar10 = 0;
                    pvVar14 = pvVar31;
                    for (; uVar24 != uVar3; uVar24 = uVar24 + 1) {
                      lVar1 = uVar24 + lVar30 * local_c8;
                      if (this->pad_top <= lVar1) {
                        if ((iVar12 + iVar4) - this->pad_bottom <= lVar1) break;
                        for (uVar29 = 0; uVar15 != uVar29; uVar29 = uVar29 + 1) {
                          if ((long)this->pad_left <= (long)(lVar32 + uVar29)) {
                            if ((long)(iVar17 - this->pad_right) <= (long)(lVar32 + uVar29)) break;
                            fVar33 = fVar33 + *(float *)((long)pvVar14 + uVar29 * 4);
                            iVar10 = iVar10 + 1;
                          }
                        }
                      }
                      pvVar14 = (void *)((long)pvVar14 + lVar16);
                    }
                    *(float *)((long)local_120 + lVar25 * 4) = fVar33 / (float)iVar10;
                    pvVar31 = (void *)((long)pvVar31 + (long)iVar18 * 4);
                    lVar32 = lVar32 + iVar18;
                  }
                  local_120 = (void *)((long)local_120 + local_b8 * 4);
                  local_118 = (void *)((long)local_118 + local_d0);
                }
                local_b0 = (void *)((long)local_b0 + local_60);
                local_c0 = uVar21;
                uVar15 = uVar21 + 1;
              }
            }
            else {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar31 = top_blob->data;
              uVar15 = uVar15 & 0xffffffff;
              if (iVar17 < 1) {
                uVar15 = 0;
              }
              if ((int)uVar3 < 1) {
                uVar19 = 0;
              }
              for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
                pvVar14 = (void *)(sVar5 * sVar6 * uVar21 + (long)pvVar31);
                for (iVar18 = 0; iVar18 <= iVar26; iVar18 = iVar18 + 1) {
                  iVar4 = this->stride_h;
                  iVar12 = this->stride_w;
                  for (lVar16 = 0; lVar16 <= iVar20; lVar16 = lVar16 + 1) {
                    fVar33 = 0.0;
                    for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
                      fVar33 = fVar33 + *(float *)((long)local_a8.data +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar24] *
                                                  4 + lVar16 * iVar12 * 4 +
                                                      (long)iVar18 * (long)iVar4 *
                                                      (long)local_a8.w *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) +
                                                      local_a8.cstep *
                                                      CONCAT44(local_a8.elemsize._4_4_,
                                                               (undefined4)local_a8.elemsize) *
                                                      uVar21);
                    }
                    *(float *)((long)pvVar14 + lVar16 * 4) = fVar33 * (1.0 / (float)iVar17);
                  }
                  pvVar14 = (void *)((long)pvVar14 + (long)iVar10 * 4);
                }
              }
            }
          }
          else if (this->pooling_type == 0) {
            pvVar31 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            uVar15 = uVar15 & 0xffffffff;
            if (iVar17 < 1) {
              uVar15 = 0;
            }
            if ((int)uVar3 < 1) {
              uVar19 = 0;
            }
            for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
              pvVar14 = (void *)(sVar5 * sVar6 * uVar21 + (long)pvVar31);
              for (iVar17 = 0; iVar17 <= iVar26; iVar17 = iVar17 + 1) {
                iVar18 = this->stride_h;
                iVar4 = this->stride_w;
                for (lVar16 = 0; lVar16 <= iVar20; lVar16 = lVar16 + 1) {
                  pfVar23 = (float *)((long)local_a8.data +
                                     lVar16 * iVar4 * 4 +
                                     (long)iVar17 * (long)iVar18 *
                                     (long)local_a8.w *
                                     CONCAT44(local_a8.elemsize._4_4_,(undefined4)local_a8.elemsize)
                                     + local_a8.cstep *
                                       CONCAT44(local_a8.elemsize._4_4_,
                                                (undefined4)local_a8.elemsize) * uVar21);
                  fVar33 = *pfVar23;
                  for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
                    fVar2 = pfVar23[_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start[uVar24]];
                    if (fVar33 <= fVar2) {
                      fVar33 = fVar2;
                    }
                  }
                  *(float *)((long)pvVar14 + lVar16 * 4) = fVar33;
                }
                pvVar14 = (void *)((long)pvVar14 + (long)iVar10 * 4);
              }
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
          iVar17 = 0;
        }
      }
      piVar9 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
      if (piVar9 == (int *)0x0) {
        return iVar17;
      }
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 != 0) {
        return iVar17;
      }
      if (local_a8.allocator != (Allocator *)0x0) {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
        return iVar17;
      }
      free(local_a8.data);
      return iVar17;
    }
    Mat::create(top_blob,this->out_w,this->out_h,uVar3,sVar5,opt->blob_allocator);
    pvVar31 = top_blob->data;
    if (pvVar31 == (void *)0x0) {
      return -100;
    }
    sVar5 = top_blob->cstep;
    if ((long)top_blob->c * sVar5 == 0) {
      return -100;
    }
    if (this->pooling_type == 0) {
      lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
      sVar6 = top_blob->elemsize;
      iVar4 = this->out_h;
      iVar20 = 0;
      if (0 < iVar4) {
        iVar20 = iVar4;
      }
      pvVar14 = bottom_blob->data;
      if ((int)uVar3 < 1) {
        uVar19 = 0;
      }
      lVar30 = (long)iVar17 * 4;
      local_e0 = pvVar14;
      for (uVar15 = 0; uVar15 != uVar19; uVar15 = uVar15 + 1) {
        local_128 = (void *)(sVar5 * sVar6 * uVar15 + (long)pvVar31);
        uVar3 = this->out_w;
        iVar26 = 0;
        uVar21 = 0;
        if (0 < (int)uVar3) {
          uVar21 = (ulong)uVar3;
        }
        while (iVar26 != iVar20) {
          iVar10 = (iVar26 * iVar18) / iVar4;
          iVar26 = iVar26 + 1;
          uVar24 = 0;
          while (uVar24 != uVar21) {
            iVar12 = ((int)uVar24 * iVar17) / (int)uVar3;
            fVar33 = *(float *)((long)pvVar14 +
                               (long)(iVar12 + iVar17 * iVar10) * 4 + lVar16 * uVar15);
            pvVar22 = (void *)(lVar30 * iVar10 + (long)local_e0);
            for (lVar32 = (long)iVar10; lVar25 = (long)iVar12,
                lVar32 < (iVar26 * iVar18 + iVar4 + -1) / iVar4; lVar32 = lVar32 + 1) {
              for (; lVar25 < (int)((int)(uVar24 + 1) * iVar17 + (uVar3 - 1)) / (int)uVar3;
                  lVar25 = lVar25 + 1) {
                fVar2 = *(float *)((long)pvVar22 + lVar25 * 4);
                if (fVar33 <= fVar2) {
                  fVar33 = fVar2;
                }
              }
              pvVar22 = (void *)((long)pvVar22 + lVar30);
            }
            *(float *)((long)local_128 + uVar24 * 4) = fVar33;
            uVar24 = uVar24 + 1;
          }
          local_128 = (void *)((long)local_128 + (long)(int)uVar3 * 4);
        }
        local_e0 = (void *)((long)local_e0 + lVar16);
      }
    }
    else if (this->pooling_type == 1) {
      local_d8 = bottom_blob->data;
      sVar6 = bottom_blob->cstep;
      sVar7 = top_blob->elemsize;
      iVar4 = this->out_h;
      iVar20 = 0;
      if (0 < iVar4) {
        iVar20 = iVar4;
      }
      if ((int)uVar3 < 1) {
        uVar19 = 0;
      }
      sVar8 = bottom_blob->elemsize;
      lVar16 = (long)iVar17 * 4;
      for (uVar15 = 0; uVar15 != uVar19; uVar15 = uVar15 + 1) {
        local_128 = (void *)(sVar5 * sVar7 * uVar15 + (long)pvVar31);
        uVar3 = this->out_w;
        iVar26 = 0;
        uVar21 = 0;
        if (0 < (int)uVar3) {
          uVar21 = (ulong)uVar3;
        }
        while (iVar26 != iVar20) {
          iVar12 = (iVar26 * iVar18) / iVar4;
          iVar26 = iVar26 + 1;
          iVar10 = (iVar26 * iVar18 + iVar4 + -1) / iVar4;
          uVar24 = 0;
          while (uVar24 != uVar21) {
            iVar13 = ((int)uVar24 * iVar17) / (int)uVar3;
            iVar11 = (int)((int)(uVar24 + 1) * iVar17 + (uVar3 - 1)) / (int)uVar3;
            fVar33 = 0.0;
            pvVar14 = (void *)(lVar16 * iVar12 + (long)local_d8);
            for (lVar30 = (long)iVar12; lVar32 = (long)iVar13, lVar30 < iVar10; lVar30 = lVar30 + 1)
            {
              for (; lVar32 < iVar11; lVar32 = lVar32 + 1) {
                fVar33 = fVar33 + *(float *)((long)pvVar14 + lVar32 * 4);
              }
              pvVar14 = (void *)((long)pvVar14 + lVar16);
            }
            *(float *)((long)local_128 + uVar24 * 4) =
                 fVar33 / ((float)(iVar11 - iVar13) * (float)(iVar10 - iVar12));
            uVar24 = uVar24 + 1;
          }
          local_128 = (void *)((long)local_128 + (long)(int)uVar3 * 4);
        }
        local_d8 = (void *)((long)local_d8 + sVar6 * sVar8);
      }
    }
  }
  else {
    Mat::create(top_blob,uVar3,sVar5,opt->blob_allocator);
    pvVar31 = top_blob->data;
    if (pvVar31 == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar28 = iVar18 * iVar17;
    if (this->pooling_type == 0) {
      pvVar14 = bottom_blob->data;
      lVar16 = bottom_blob->cstep * bottom_blob->elemsize;
      uVar15 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar15 = 0;
      }
      if ((int)uVar3 < 1) {
        uVar19 = 0;
      }
      pvVar22 = pvVar14;
      for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
        fVar33 = *(float *)((long)pvVar14 + lVar16 * uVar21);
        for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
          fVar2 = *(float *)((long)pvVar22 + uVar24 * 4);
          if (fVar33 <= fVar2) {
            fVar33 = fVar2;
          }
        }
        *(float *)((long)pvVar31 + uVar21 * 4) = fVar33;
        pvVar22 = (void *)((long)pvVar22 + lVar16);
      }
      return 0;
    }
    if (this->pooling_type == 1) {
      pvVar14 = bottom_blob->data;
      sVar5 = bottom_blob->cstep;
      uVar15 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar15 = 0;
      }
      if ((int)uVar3 < 1) {
        uVar19 = 0;
      }
      sVar6 = bottom_blob->elemsize;
      for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
        fVar33 = 0.0;
        for (uVar24 = 0; uVar15 != uVar24; uVar24 = uVar24 + 1) {
          fVar33 = fVar33 + *(float *)((long)pvVar14 + uVar24 * 4);
        }
        *(float *)((long)pvVar31 + uVar21 * 4) = fVar33 * (1.0 / (float)(int)uVar28);
        pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}